

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gameboard.cpp
# Opt level: O3

bool __thiscall GameBoard::containsAnXorAnO(GameBoard *this,Field *field)

{
  int iVar1;
  bool bVar2;
  QArrayData *local_40;
  QChar *local_38;
  longlong local_30;
  QArrayData *local_28;
  QChar *local_20;
  longlong local_18;
  
  QAbstractButton::text();
  if (local_20 == (QChar *)0x0) {
    local_20 = (QChar *)&QString::_empty;
  }
  iVar1 = QString::compare_helper(local_20,local_18,"X",-1,CaseSensitive);
  if (iVar1 == 0) {
    bVar2 = true;
  }
  else {
    QAbstractButton::text();
    if (local_38 == (QChar *)0x0) {
      local_38 = (QChar *)&QString::_empty;
    }
    iVar1 = QString::compare_helper(local_38,local_30,"O",-1,CaseSensitive);
    bVar2 = iVar1 == 0;
    if (local_40 != (QArrayData *)0x0) {
      LOCK();
      (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40,2,8);
      }
    }
  }
  if (local_28 != (QArrayData *)0x0) {
    LOCK();
    (local_28->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_28->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_28->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_28,2,8);
    }
  }
  return bVar2;
}

Assistant:

bool GameBoard::containsAnXorAnO(Field *field)
{
    return field->text() == "X" || field->text() == "O";
}